

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *
vkt::pipeline::anon_unknown_2::createComponentSwizzleTests
          (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           *__return_storage_ptr__,TestContext *testCtx,VkImageViewType viewType,
          VkFormat imageFormat)

{
  ulong uVar1;
  TestCaseGroup *this;
  size_type sVar2;
  TestNode *this_00;
  ImageViewTest *this_01;
  const_reference pvVar3;
  char *name;
  VkComponentMapping *componentMapping;
  string local_a0;
  ulong local_80;
  size_t mappingNdx;
  undefined1 local_61;
  undefined1 local_60 [8];
  vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> componentMappings;
  VkComponentMapping baseMapping;
  VkImageSubresourceRange subresourceRange;
  deUint32 arraySize;
  VkFormat imageFormat_local;
  VkImageViewType viewType_local;
  TestContext *testCtx_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *swizzleTests;
  
  if (((VK_IMAGE_VIEW_TYPE_3D < viewType) && (viewType != VK_IMAGE_VIEW_TYPE_CUBE)) &&
     (viewType - VK_IMAGE_VIEW_TYPE_1D_ARRAY < 3)) {
    ImageViewTest::getArraySize(viewType);
  }
  baseMapping.b = VK_COMPONENT_SWIZZLE_ZERO;
  baseMapping.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  ImageViewTest::getNumLevels(viewType);
  componentMappings.
  super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x400000003;
  baseMapping.r = VK_COMPONENT_SWIZZLE_B;
  baseMapping.g = VK_COMPONENT_SWIZZLE_A;
  getComponentMappingPermutations
            ((vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *)local_60,
             (VkComponentMapping *)
             &componentMappings.
              super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_61 = 0;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(this,testCtx,"component_swizzle","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&mappingNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            (__return_storage_ptr__,this);
  for (local_80 = 0; uVar1 = local_80,
      sVar2 = std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::size
                        ((vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *)
                         local_60), uVar1 < sVar2; local_80 = local_80 + 1) {
    this_00 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::operator->(&__return_storage_ptr__->
                             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                           )->super_TestNode;
    this_01 = (ImageViewTest *)operator_new(0xa0);
    pvVar3 = std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::
             operator[]((vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *)
                        local_60,local_80);
    pipeline::(anonymous_namespace)::getComponentMappingCaseName_abi_cxx11_
              (&local_a0,(_anonymous_namespace_ *)pvVar3,componentMapping);
    name = (char *)std::__cxx11::string::c_str();
    pvVar3 = std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::
             operator[]((vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *)
                        local_60,local_80);
    ImageViewTest::ImageViewTest
              (this_01,testCtx,name,"",viewType,imageFormat,0.0,pvVar3,
               (VkImageSubresourceRange *)&baseMapping.b);
    tcu::TestNode::addChild(this_00,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  local_61 = 1;
  std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::~vector
            ((vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<tcu::TestCaseGroup> createComponentSwizzleTests (tcu::TestContext& testCtx, VkImageViewType viewType, VkFormat imageFormat)
{
	deUint32 arraySize = 0;

	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		case VK_IMAGE_VIEW_TYPE_2D:
		case VK_IMAGE_VIEW_TYPE_3D:
			arraySize = 1;
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
			arraySize = 6;
			break;

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			arraySize = ImageViewTest::getArraySize(viewType);
			break;

		default:
			break;
	}

	const VkImageSubresourceRange subresourceRange =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,							// VkImageAspectFlags	aspectMask;
		0u,													// deUint32				baseMipLevel;
		(deUint32)ImageViewTest::getNumLevels(viewType),	// deUint32				mipLevels;
		0u,													// deUint32				baseArrayLayer;
		arraySize,											// deUint32				arraySize;
	};

	const VkComponentMapping				baseMapping			= { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A };
	const std::vector<VkComponentMapping>	componentMappings	= getComponentMappingPermutations(baseMapping);
	de::MovePtr<tcu::TestCaseGroup>			swizzleTests		(new tcu::TestCaseGroup(testCtx, "component_swizzle", ""));

	for (size_t mappingNdx = 0; mappingNdx < componentMappings.size(); mappingNdx++)
	{
		swizzleTests->addChild(new ImageViewTest(testCtx,
												 getComponentMappingCaseName(componentMappings[mappingNdx]).c_str(),
												 "",
												 viewType,
												 imageFormat,
												 0.0f,
												 componentMappings[mappingNdx],
												 subresourceRange));
	}

	return swizzleTests;
}